

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O3

uint glTF2::ComponentTypeSize(ComponentType t)

{
  runtime_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((t - ComponentType_BYTE < 7) && ((0x6fU >> (t & 0x1f) & 1) != 0)) {
    return *(uint *)(&DAT_0077ddb4 + (ulong)(t - ComponentType_BYTE) * 4);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  to_string<glTF2::ComponentType>(&sStack_58,t);
  std::operator+(&local_38,"GLTF: Unsupported Component Type ",&sStack_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_008bf448;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
    unsigned int ComponentTypeSize(ComponentType t)
    {
        switch (t) {
            case ComponentType_SHORT:
            case ComponentType_UNSIGNED_SHORT:
                return 2;

            case ComponentType_UNSIGNED_INT:
            case ComponentType_FLOAT:
                return 4;

            case ComponentType_BYTE:
            case ComponentType_UNSIGNED_BYTE:
                return 1;
            default:
                throw DeadlyImportError("GLTF: Unsupported Component Type " + to_string(t));
        }
    }